

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O2

void exit_cb(uv_process_t *process,int64_t exit_status,int term_signal)

{
  char *pcVar1;
  undefined8 uVar2;
  int64_t eval_b;
  int64_t eval_a;
  
  puts("exit_cb");
  exit_cb_called = exit_cb_called + 1;
  if (exit_status == 0) {
    eval_a = (int64_t)term_signal;
    if (eval_a == 0) {
      uv_close((uv_handle_t *)process,close_cb);
      uv_close((uv_handle_t *)&in,close_cb);
      uv_close((uv_handle_t *)&out,close_cb);
      return;
    }
    pcVar1 = "term_signal";
    uVar2 = 0x38;
  }
  else {
    pcVar1 = "exit_status";
    uVar2 = 0x37;
    eval_a = exit_status;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-stdio-over-pipes.c"
          ,uVar2,pcVar1,"==","0",eval_a,"==",0);
  abort();
}

Assistant:

static void exit_cb(uv_process_t* process,
                    int64_t exit_status,
                    int term_signal) {
  printf("exit_cb\n");
  exit_cb_called++;
  ASSERT_EQ(1, exit_status);
  ASSERT_OK(term_signal);
  uv_close((uv_handle_t*) process, close_cb);
}